

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlmain.c
# Opt level: O3

ebml_element * EBML_FindNextId(stream *Input,ebml_context *Context,size_t MaxDataSize)

{
  stream *psVar1;
  char cVar2;
  long lVar3;
  filepos_t fVar4;
  ebml_element *p;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  uint8_t *puVar10;
  int in_R9D;
  ulong uVar11;
  byte *pbVar12;
  int iVar13;
  bool bVar14;
  uint8_t PossibleId [4];
  filepos_t SizeUnknown;
  uint8_t PossibleSize [8];
  byte local_7c [4];
  stream *local_78;
  ulong local_70;
  ulong local_68;
  filepos_t local_60;
  size_t local_58;
  ebml_context *local_50;
  filepos_t local_48;
  filepos_t local_40;
  uint8_t local_38 [8];
  
  local_60 = 8;
  local_78 = Input;
  if (Input == (stream *)0x0) {
    __assert_fail("(const void*)(Input)!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmain.c"
                  ,0x13d,
                  "ebml_element *EBML_FindNextId(struct stream *, const ebml_context *, size_t)");
  }
  uVar11 = 0;
  uVar6 = 0;
  fVar4 = 0;
  uVar8 = 0;
  local_58 = MaxDataSize;
  local_50 = Context;
  do {
    psVar1 = local_78;
    local_40 = (**(code **)((long)(local_78->Base).VMT + 0x78))(local_78,0,1);
    lVar3 = (**(code **)((long)(psVar1->Base).VMT + 0x60))(psVar1,local_7c + (char)uVar6,1,0);
    if (lVar3 == 0) {
      pbVar12 = local_7c + (char)((char)uVar6 + '\x01');
      uVar7 = 0x80;
      iVar13 = 1;
      local_48 = fVar4;
      do {
        if (iVar13 == (char)uVar6) goto LAB_001151c9;
        uVar9 = uVar6 & 0xffffffff;
        uVar5 = (int)uVar6 + 1;
        if ('\x04' < (char)uVar5) goto LAB_001151c9;
        bVar14 = (uVar7 & local_7c[0]) == 0;
        if (!bVar14) break;
        uVar7 = uVar7 >> 1;
        local_70 = (ulong)uVar5;
        lVar3 = (**(code **)((long)(local_78->Base).VMT + 0x60))(local_78,pbVar12,1,0);
        pbVar12 = pbVar12 + 1;
        iVar13 = iVar13 + 1;
        uVar6 = local_70;
      } while (lVar3 == 0);
      uVar6 = CONCAT71((int7)(uVar9 >> 8),(char)uVar9 + '\x01');
      fVar4 = local_48;
    }
    else {
      bVar14 = true;
    }
    local_70 = (**(code **)((long)(local_78->Base).VMT + 0x78))(local_78,0,1);
    cVar2 = (char)uVar11;
    uVar11 = uVar11 & 0xff;
    do {
      cVar2 = cVar2 + '\x01';
      if (7 < uVar11) goto LAB_001151c9;
      puVar10 = local_38 + uVar11;
      uVar11 = uVar11 + 1;
      lVar3 = (**(code **)((long)(local_78->Base).VMT + 0x60))(local_78,puVar10,1,0);
      uVar9 = uVar8;
      if (lVar3 != 0) break;
      local_68 = uVar11;
      fVar4 = EBML_ReadCodedSizeValue(local_38,&local_68,&local_60);
      uVar8 = 0;
      uVar9 = local_68;
    } while (local_68 == 0);
    uVar8 = uVar9;
    if (!bVar14) {
      p = CreateElement(local_78,local_7c,(int8_t)uVar6,local_50,(ebml_master *)0xffffffff,in_R9D);
      if (p == (ebml_element *)0x0) {
        __assert_fail("Result != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmain.c"
                      ,0x162,
                      "ebml_element *EBML_FindNextId(struct stream *, const ebml_context *, size_t)"
                     );
      }
      p->SizeLength = cVar2;
      p->DataSize = fVar4;
      lVar3 = (**(code **)((long)(p->Base).Base.VMT + 0x70))(p);
      if ((lVar3 == 0) || ((fVar4 != local_60 && (local_58 < (ulong)p->DataSize)))) {
        NodeDelete((node *)p);
LAB_001151c9:
        p = (ebml_element *)0x0;
      }
      else {
        p->ElementPosition = local_40;
        p->SizePosition = local_70;
        p->EndPosition = fVar4 + local_70 + uVar9;
      }
      return p;
    }
  } while( true );
}

Assistant:

ebml_element *EBML_FindNextId(struct stream *Input, const ebml_context *Context, size_t MaxDataSize)
{
    filepos_t aElementPosition, aSizePosition;
    filepos_t SizeFound=0, SizeUnknown=8;
    int ReadSize;
    uint8_t BitMask;
    uint8_t PossibleId[4];
    uint8_t PossibleSize[8]; // we don't support size stored in more than 64 bits
    bool_t bElementFound = 0;
    int8_t PossibleID_Length = 0;
    size_t _SizeLength=0;
    uint8_t PossibleSizeLength = 0;
    ebml_element *Result = NULL;

    while (!bElementFound)
    {
        aElementPosition = Stream_Seek(Input,0,SEEK_CUR);
        ReadSize = 0;
        BitMask = 1 << 7;
        for (;;)
        {
            if (Stream_ReadOneOrMore(Input,&PossibleId[PossibleID_Length], 1, NULL)!=ERR_NONE)
                break;
            ReadSize++;
            if (ReadSize == PossibleID_Length)
                return NULL; // No more data ?
            if (++PossibleID_Length > 4)
                return NULL; // we don't support element IDs over class D
            if (PossibleId[0] & BitMask)
            {
                bElementFound = 1;
                break;
            }
            BitMask >>= 1;
        }

        // read the data size
        aSizePosition = Stream_Seek(Input,0,SEEK_CUR);
        do {
            if (PossibleSizeLength >= 8)
                // Size is larger than 8 bytes
                return NULL;

            if (Stream_ReadOneOrMore(Input,&PossibleSize[PossibleSizeLength++], 1, NULL)!=ERR_NONE)
                break;
            ReadSize++;
            _SizeLength = PossibleSizeLength;
            SizeFound = EBML_ReadCodedSizeValue(&PossibleSize[0], &_SizeLength, &SizeUnknown);
        } while (_SizeLength == 0);
    }

    // look for the ID in the provided context
    Result = CreateElement(Input, PossibleId, PossibleID_Length, Context,NULL, EBML_ANY_PROFILE);
    assert(Result != NULL);
#if 0
if (PossibleID_Length==4)
printf("Elt: size %d id %d %02X%02X%02X%02X\n",SizeFound,PossibleID_Length,PossibleId[0],PossibleId[1],PossibleId[2],PossibleId[3]);
else if (PossibleID_Length==3)
printf("Elt: size %d id %d %02X%02X%02X\n",SizeFound,PossibleID_Length,PossibleId[0],PossibleId[1],PossibleId[2]);
else if (PossibleID_Length==2)
printf("Elt: size %d id %d %02X%02X\n",SizeFound,PossibleID_Length,PossibleId[0],PossibleId[1]);
else if (PossibleID_Length==1)
printf("Elt: size %d id %d %02X\n",SizeFound,PossibleID_Length,PossibleId[0]);
#endif
    Result->SizeLength = PossibleSizeLength;
    Result->DataSize = SizeFound;
    if (!EBML_ElementValidateSize(Result) || (SizeFound != SizeUnknown && MaxDataSize < (size_t)Result->DataSize))
    {
        NodeDelete((node*)Result);
        return NULL;
    }
    Result->ElementPosition = aElementPosition;
    Result->SizePosition = aSizePosition;
    Result->EndPosition = aSizePosition + _SizeLength + SizeFound;

    return Result;
}